

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 (*pauVar27) [16];
  byte bVar28;
  undefined1 (*pauVar29) [16];
  long lVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  Geometry *geometry;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  byte bVar46;
  uint uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined4 uVar83;
  vint4 ai_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  vint4 ai;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar98;
  float fVar102;
  float fVar103;
  vint4 ai_3;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar104;
  float fVar105;
  float fVar109;
  float fVar110;
  vint4 ai_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar108 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  vint4 ai_4;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  vint4 ai_6;
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar127 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  ulong local_1320;
  ulong local_1318;
  ulong local_1310;
  ulong local_1308;
  ulong local_1300;
  ulong local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  ulong local_12e0;
  ulong local_12d8;
  long local_12d0;
  long local_12c8;
  long local_12c0;
  ulong local_12b8;
  RTCFilterFunctionNArguments local_12b0;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  byte local_111f;
  float local_1100 [4];
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  undefined4 uStack_10e4;
  float local_10e0 [4];
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  int local_1030;
  int iStack_102c;
  int iStack_1028;
  int iStack_1024;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar29 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar135 = ZEXT1664(auVar48);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar136 = ZEXT1664(auVar49);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar137 = ZEXT1664(auVar50);
  auVar48 = vmulss_avx512f(auVar48,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar51._0_4_ = auVar48._0_4_;
  auVar51._4_4_ = auVar51._0_4_;
  auVar51._8_4_ = auVar51._0_4_;
  auVar51._12_4_ = auVar51._0_4_;
  auVar48 = vmulss_avx512f(auVar49,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar49._0_4_ = auVar48._0_4_;
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  auVar48 = vmulss_avx512f(auVar50,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar50._0_4_ = auVar48._0_4_;
  auVar50._4_4_ = auVar50._0_4_;
  auVar50._8_4_ = auVar50._0_4_;
  auVar50._12_4_ = auVar50._0_4_;
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar44 = uVar39 ^ 0x10;
  uVar38 = uVar40 ^ 0x10;
  local_12b8 = uVar35 ^ 0x10;
  auVar48 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar138 = ZEXT1664(auVar48);
  auVar106._8_4_ = 0x80000000;
  auVar106._0_8_ = 0x8000000080000000;
  auVar106._12_4_ = 0x80000000;
  auVar48 = vxorps_avx512vl(auVar51,auVar106);
  auVar139 = ZEXT1664(auVar48);
  auVar48 = vxorps_avx512vl(auVar49,auVar106);
  auVar140 = ZEXT1664(auVar48);
  auVar48 = vxorps_avx512vl(auVar50,auVar106);
  auVar141 = ZEXT1664(auVar48);
  auVar48 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar142 = ZEXT1664(auVar48);
  local_12d8 = uVar39 >> 2;
  local_12e0 = uVar44 >> 2;
  local_12e8 = uVar40 >> 2;
  local_12f0 = uVar38 >> 2;
  local_12f8 = uVar35 >> 2;
  local_1300 = local_12b8 >> 2;
  auVar48 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar143 = ZEXT1664(auVar48);
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar144 = ZEXT3264(auVar65);
  local_11e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_1320 = uVar44;
  local_1318 = uVar35;
  local_1310 = uVar40;
  local_1308 = uVar39;
LAB_006f6172:
  while (pauVar27 = pauVar29 + -1, pauVar29 = pauVar29 + -1,
        *(float *)((long)*pauVar27 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
    uVar42 = *(ulong *)*pauVar29;
    while( true ) {
      if ((uVar42 & 8) != 0) {
        local_12d0 = (ulong)((uint)uVar42 & 0xf) - 8;
        if (local_12d0 == 0) goto LAB_006f6f41;
        uVar42 = uVar42 & 0xfffffffffffffff0;
        local_12c8 = 0;
        goto LAB_006f6453;
      }
      auVar48 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + uVar39),auVar139._0_16_,
                           auVar135._0_16_);
      auVar49 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + uVar40),auVar140._0_16_,
                           auVar136._0_16_);
      auVar48 = vpmaxsd_avx(auVar48,auVar49);
      auVar50 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + uVar35),auVar141._0_16_,
                           auVar137._0_16_);
      auVar49 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + uVar44),auVar139._0_16_,
                           auVar135._0_16_);
      auVar51 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + uVar38),auVar140._0_16_,
                           auVar136._0_16_);
      auVar49 = vpminsd_avx(auVar49,auVar51);
      auVar51 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar42 + 0x20 + local_12b8),auVar141._0_16_,
                           auVar137._0_16_);
      auVar50 = vpmaxsd_avx512vl(auVar50,auVar142._0_16_);
      auVar48 = vpmaxsd_avx(auVar48,auVar50);
      auVar50 = vpminsd_avx512vl(auVar51,auVar138._0_16_);
      auVar49 = vpminsd_avx(auVar49,auVar50);
      uVar45 = vpcmpd_avx512vl(auVar48,auVar49,2);
      uVar45 = uVar45 & 0xf;
      local_11a0._0_16_ = auVar48;
      if ((char)uVar45 == '\0') break;
      uVar33 = uVar42 & 0xfffffffffffffff0;
      lVar30 = 0;
      for (uVar42 = uVar45; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar42 = *(ulong *)(uVar33 + lVar30 * 8);
      uVar34 = (uint)uVar45 - 1 & (uint)uVar45;
      uVar45 = (ulong)uVar34;
      if (uVar34 != 0) {
        uVar32 = *(uint *)(local_11a0 + lVar30 * 4);
        lVar30 = 0;
        for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar34 = uVar34 - 1 & uVar34;
        uVar37 = (ulong)uVar34;
        uVar45 = *(ulong *)(uVar33 + lVar30 * 8);
        uVar47 = *(uint *)(local_11a0 + lVar30 * 4);
        if (uVar34 == 0) {
          if (uVar32 < uVar47) {
            *(ulong *)*pauVar29 = uVar45;
            *(uint *)((long)*pauVar29 + 8) = uVar47;
            pauVar29 = pauVar29 + 1;
          }
          else {
            *(ulong *)*pauVar29 = uVar42;
            *(uint *)((long)*pauVar29 + 8) = uVar32;
            pauVar29 = pauVar29 + 1;
            uVar42 = uVar45;
          }
        }
        else {
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar42;
          auVar48 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar32));
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar45;
          auVar49 = vpunpcklqdq_avx(auVar92,ZEXT416(uVar47));
          lVar30 = 0;
          for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar30 = lVar30 + 1;
          }
          uVar34 = uVar34 - 1 & uVar34;
          uVar42 = (ulong)uVar34;
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)(uVar33 + lVar30 * 8);
          auVar85 = vpunpcklqdq_avx(auVar93,ZEXT416(*(uint *)(local_11a0 + lVar30 * 4)));
          auVar50 = vpshufd_avx(auVar48,0xaa);
          auVar51 = vpshufd_avx(auVar49,0xaa);
          auVar106 = vpshufd_avx(auVar85,0xaa);
          if (uVar34 == 0) {
            uVar42 = vpcmpgtd_avx512vl(auVar51,auVar50);
            uVar42 = uVar42 & 0xf;
            auVar51 = vpblendmd_avx512vl(auVar49,auVar48);
            bVar12 = (bool)((byte)uVar42 & 1);
            auVar52._0_4_ = (uint)bVar12 * auVar51._0_4_ | (uint)!bVar12 * auVar50._0_4_;
            bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar12 * auVar51._4_4_ | (uint)!bVar12 * auVar50._4_4_;
            bVar12 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar12 * auVar51._8_4_ | (uint)!bVar12 * auVar50._8_4_;
            bVar12 = SUB81(uVar42 >> 3,0);
            auVar52._12_4_ = (uint)bVar12 * auVar51._12_4_ | (uint)!bVar12 * auVar50._12_4_;
            auVar49 = vmovdqa32_avx512vl(auVar49);
            bVar12 = (bool)((byte)uVar42 & 1);
            auVar53._0_4_ = (uint)bVar12 * auVar49._0_4_ | (uint)!bVar12 * auVar48._0_4_;
            bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar12 * auVar49._4_4_ | (uint)!bVar12 * auVar48._4_4_;
            bVar12 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar12 * auVar49._8_4_ | (uint)!bVar12 * auVar48._8_4_;
            bVar12 = SUB81(uVar42 >> 3,0);
            auVar53._12_4_ = (uint)bVar12 * auVar49._12_4_ | (uint)!bVar12 * auVar48._12_4_;
            auVar48 = vpshufd_avx(auVar52,0xaa);
            uVar45 = vpcmpgtd_avx512vl(auVar106,auVar48);
            uVar45 = uVar45 & 0xf;
            auVar49 = vpblendmd_avx512vl(auVar85,auVar52);
            bVar12 = (bool)((byte)uVar45 & 1);
            bVar9 = (bool)((byte)(uVar45 >> 1) & 1);
            uVar42 = CONCAT44((uint)bVar9 * auVar49._4_4_ | (uint)!bVar9 * auVar48._4_4_,
                              (uint)bVar12 * auVar49._0_4_ | (uint)!bVar12 * auVar48._0_4_);
            auVar48 = vmovdqa32_avx512vl(auVar85);
            bVar12 = (bool)((byte)uVar45 & 1);
            auVar54._0_4_ = (uint)bVar12 * auVar48._0_4_ | !bVar12 * auVar52._0_4_;
            bVar12 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar54._4_4_ = (uint)bVar12 * auVar48._4_4_ | !bVar12 * auVar52._4_4_;
            bVar12 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar54._8_4_ = (uint)bVar12 * auVar48._8_4_ | !bVar12 * auVar52._8_4_;
            bVar12 = SUB81(uVar45 >> 3,0);
            auVar54._12_4_ = (uint)bVar12 * auVar48._12_4_ | !bVar12 * auVar52._12_4_;
            auVar48 = vpshufd_avx(auVar54,0xaa);
            auVar49 = vpshufd_avx(auVar53,0xaa);
            uVar45 = vpcmpgtd_avx512vl(auVar48,auVar49);
            uVar45 = uVar45 & 0xf;
            auVar49 = vpblendmd_avx512vl(auVar54,auVar53);
            bVar12 = (bool)((byte)uVar45 & 1);
            auVar55._0_4_ = (uint)bVar12 * auVar49._0_4_ | (uint)!bVar12 * auVar48._0_4_;
            bVar12 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar12 * auVar49._4_4_ | (uint)!bVar12 * auVar48._4_4_;
            bVar12 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar12 * auVar49._8_4_ | (uint)!bVar12 * auVar48._8_4_;
            bVar12 = SUB81(uVar45 >> 3,0);
            auVar55._12_4_ = (uint)bVar12 * auVar49._12_4_ | (uint)!bVar12 * auVar48._12_4_;
            auVar48 = vmovdqa32_avx512vl(auVar54);
            bVar12 = (bool)((byte)uVar45 & 1);
            auVar56._0_4_ = (uint)bVar12 * auVar48._0_4_ | !bVar12 * auVar53._0_4_;
            bVar12 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar56._4_4_ = (uint)bVar12 * auVar48._4_4_ | !bVar12 * auVar53._4_4_;
            bVar12 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar56._8_4_ = (uint)bVar12 * auVar48._8_4_ | !bVar12 * auVar53._8_4_;
            bVar12 = SUB81(uVar45 >> 3,0);
            auVar56._12_4_ = (uint)bVar12 * auVar48._12_4_ | !bVar12 * auVar53._12_4_;
            *pauVar29 = auVar56;
            pauVar29[1] = auVar55;
            pauVar29 = pauVar29 + 2;
          }
          else {
            lVar30 = 0;
            for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              lVar30 = lVar30 + 1;
            }
            uVar34 = *(uint *)(local_11a0 + lVar30 * 4);
            auVar121._8_8_ = 0;
            auVar121._0_8_ = *(ulong *)(uVar33 + lVar30 * 8);
            auVar86 = vpunpcklqdq_avx(auVar121,ZEXT416(uVar34));
            uVar42 = vpcmpgtd_avx512vl(auVar51,auVar50);
            uVar42 = uVar42 & 0xf;
            auVar51 = vpblendmd_avx512vl(auVar49,auVar48);
            bVar12 = (bool)((byte)uVar42 & 1);
            auVar57._0_4_ = (uint)bVar12 * auVar51._0_4_ | (uint)!bVar12 * auVar50._0_4_;
            bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar12 * auVar51._4_4_ | (uint)!bVar12 * auVar50._4_4_;
            bVar12 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar12 * auVar51._8_4_ | (uint)!bVar12 * auVar50._8_4_;
            bVar12 = SUB81(uVar42 >> 3,0);
            auVar57._12_4_ = (uint)bVar12 * auVar51._12_4_ | (uint)!bVar12 * auVar50._12_4_;
            auVar49 = vmovdqa32_avx512vl(auVar49);
            bVar12 = (bool)((byte)uVar42 & 1);
            auVar58._0_4_ = (uint)bVar12 * auVar49._0_4_ | (uint)!bVar12 * auVar48._0_4_;
            bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar58._4_4_ = (uint)bVar12 * auVar49._4_4_ | (uint)!bVar12 * auVar48._4_4_;
            bVar12 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar58._8_4_ = (uint)bVar12 * auVar49._8_4_ | (uint)!bVar12 * auVar48._8_4_;
            bVar12 = SUB81(uVar42 >> 3,0);
            auVar58._12_4_ = (uint)bVar12 * auVar49._12_4_ | (uint)!bVar12 * auVar48._12_4_;
            auVar99._4_4_ = uVar34;
            auVar99._0_4_ = uVar34;
            auVar99._8_4_ = uVar34;
            auVar99._12_4_ = uVar34;
            uVar42 = vpcmpgtd_avx512vl(auVar99,auVar106);
            uVar42 = uVar42 & 0xf;
            auVar48 = vpblendmd_avx512vl(auVar86,auVar85);
            bVar12 = (bool)((byte)uVar42 & 1);
            auVar59._0_4_ = (uint)bVar12 * auVar48._0_4_ | !bVar12 * uVar34;
            bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar59._4_4_ = (uint)bVar12 * auVar48._4_4_ | !bVar12 * uVar34;
            bVar12 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar59._8_4_ = (uint)bVar12 * auVar48._8_4_ | !bVar12 * uVar34;
            bVar12 = SUB81(uVar42 >> 3,0);
            auVar59._12_4_ = (uint)bVar12 * auVar48._12_4_ | !bVar12 * uVar34;
            auVar48 = vmovdqa32_avx512vl(auVar86);
            bVar12 = (bool)((byte)uVar42 & 1);
            auVar60._0_4_ = (uint)bVar12 * auVar48._0_4_ | (uint)!bVar12 * auVar85._0_4_;
            bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar12 * auVar48._4_4_ | (uint)!bVar12 * auVar85._4_4_;
            bVar12 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar12 * auVar48._8_4_ | (uint)!bVar12 * auVar85._8_4_;
            bVar12 = SUB81(uVar42 >> 3,0);
            auVar60._12_4_ = (uint)bVar12 * auVar48._12_4_ | (uint)!bVar12 * auVar85._12_4_;
            auVar48 = vpshufd_avx(auVar60,0xaa);
            auVar49 = vpshufd_avx(auVar58,0xaa);
            uVar42 = vpcmpgtd_avx512vl(auVar48,auVar49);
            uVar42 = uVar42 & 0xf;
            auVar49 = vpblendmd_avx512vl(auVar60,auVar58);
            bVar12 = (bool)((byte)uVar42 & 1);
            auVar61._0_4_ = (uint)bVar12 * auVar49._0_4_ | (uint)!bVar12 * auVar48._0_4_;
            bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar12 * auVar49._4_4_ | (uint)!bVar12 * auVar48._4_4_;
            bVar12 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar12 * auVar49._8_4_ | (uint)!bVar12 * auVar48._8_4_;
            bVar12 = SUB81(uVar42 >> 3,0);
            auVar61._12_4_ = (uint)bVar12 * auVar49._12_4_ | (uint)!bVar12 * auVar48._12_4_;
            auVar50 = vmovdqa32_avx512vl(auVar60);
            bVar12 = (bool)((byte)uVar42 & 1);
            bVar11 = (bool)((byte)(uVar42 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar42 >> 2) & 1);
            bVar10 = SUB81(uVar42 >> 3,0);
            auVar48 = vpshufd_avx(auVar59,0xaa);
            auVar49 = vpshufd_avx(auVar57,0xaa);
            uVar45 = vpcmpgtd_avx512vl(auVar48,auVar49);
            uVar45 = uVar45 & 0xf;
            auVar49 = vpblendmd_avx512vl(auVar59,auVar57);
            bVar9 = (bool)((byte)uVar45 & 1);
            bVar7 = (bool)((byte)(uVar45 >> 1) & 1);
            uVar42 = CONCAT44((uint)bVar7 * auVar49._4_4_ | (uint)!bVar7 * auVar48._4_4_,
                              (uint)bVar9 * auVar49._0_4_ | (uint)!bVar9 * auVar48._0_4_);
            auVar48 = vmovdqa32_avx512vl(auVar59);
            bVar9 = (bool)((byte)uVar45 & 1);
            auVar62._0_4_ = (uint)bVar9 * auVar48._0_4_ | !bVar9 * auVar57._0_4_;
            bVar9 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar9 * auVar48._4_4_ | !bVar9 * auVar57._4_4_;
            bVar9 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar9 * auVar48._8_4_ | !bVar9 * auVar57._8_4_;
            bVar9 = SUB81(uVar45 >> 3,0);
            auVar62._12_4_ = (uint)bVar9 * auVar48._12_4_ | !bVar9 * auVar57._12_4_;
            auVar48 = vpshufd_avx(auVar62,0xaa);
            auVar49 = vpshufd_avx(auVar61,0xaa);
            uVar45 = vpcmpgtd_avx512vl(auVar49,auVar48);
            uVar45 = uVar45 & 0xf;
            auVar49 = vpblendmd_avx512vl(auVar61,auVar62);
            bVar9 = (bool)((byte)uVar45 & 1);
            auVar63._0_4_ = (uint)bVar9 * auVar49._0_4_ | (uint)!bVar9 * auVar48._0_4_;
            bVar9 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar63._4_4_ = (uint)bVar9 * auVar49._4_4_ | (uint)!bVar9 * auVar48._4_4_;
            bVar9 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar63._8_4_ = (uint)bVar9 * auVar49._8_4_ | (uint)!bVar9 * auVar48._8_4_;
            bVar9 = SUB81(uVar45 >> 3,0);
            auVar63._12_4_ = (uint)bVar9 * auVar49._12_4_ | (uint)!bVar9 * auVar48._12_4_;
            auVar48 = vmovdqa32_avx512vl(auVar61);
            bVar9 = (bool)((byte)uVar45 & 1);
            auVar64._0_4_ = (uint)bVar9 * auVar48._0_4_ | !bVar9 * auVar62._0_4_;
            bVar9 = (bool)((byte)(uVar45 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar9 * auVar48._4_4_ | !bVar9 * auVar62._4_4_;
            bVar9 = (bool)((byte)(uVar45 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar9 * auVar48._8_4_ | !bVar9 * auVar62._8_4_;
            bVar9 = SUB81(uVar45 >> 3,0);
            auVar64._12_4_ = (uint)bVar9 * auVar48._12_4_ | !bVar9 * auVar62._12_4_;
            *(uint *)*pauVar29 = (uint)bVar12 * auVar50._0_4_ | !bVar12 * auVar58._0_4_;
            *(uint *)((long)*pauVar29 + 4) = (uint)bVar11 * auVar50._4_4_ | !bVar11 * auVar58._4_4_;
            *(uint *)((long)*pauVar29 + 8) = (uint)bVar8 * auVar50._8_4_ | !bVar8 * auVar58._8_4_;
            *(uint *)((long)*pauVar29 + 0xc) =
                 (uint)bVar10 * auVar50._12_4_ | !bVar10 * auVar58._12_4_;
            pauVar29[1] = auVar64;
            pauVar29[2] = auVar63;
            pauVar29 = pauVar29 + 3;
          }
        }
      }
    }
    if (pauVar29 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  }
  goto LAB_006f6f5d;
LAB_006f6453:
  do {
    lVar30 = local_12c8 * 0x58;
    local_12c0 = lVar30 + uVar42;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = *(ulong *)(uVar42 + 0x20 + lVar30);
    auVar94._8_8_ = 0;
    auVar94._0_8_ = *(ulong *)(uVar42 + 0x24 + lVar30);
    uVar17 = vpcmpub_avx512vl(auVar48,auVar94,2);
    uVar83 = *(undefined4 *)(uVar42 + 0x38 + lVar30);
    auVar85._4_4_ = uVar83;
    auVar85._0_4_ = uVar83;
    auVar85._8_4_ = uVar83;
    auVar85._12_4_ = uVar83;
    uVar83 = *(undefined4 *)(uVar42 + 0x44 + lVar30);
    auVar95._4_4_ = uVar83;
    auVar95._0_4_ = uVar83;
    auVar95._8_4_ = uVar83;
    auVar95._12_4_ = uVar83;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = *(ulong *)(local_12d8 + 0x20 + local_12c0);
    auVar48 = vpmovzxbd_avx(auVar100);
    auVar48 = vcvtdq2ps_avx(auVar48);
    auVar49 = vfmadd213ps_fma(auVar48,auVar95,auVar85);
    auVar107._8_8_ = 0;
    auVar107._0_8_ = *(ulong *)(local_12e0 + 0x20 + local_12c0);
    auVar48 = vpmovzxbd_avx(auVar107);
    auVar48 = vcvtdq2ps_avx(auVar48);
    auVar50 = vfmadd213ps_fma(auVar48,auVar95,auVar85);
    uVar83 = *(undefined4 *)(uVar42 + 0x3c + lVar30);
    auVar86._4_4_ = uVar83;
    auVar86._0_4_ = uVar83;
    auVar86._8_4_ = uVar83;
    auVar86._12_4_ = uVar83;
    uVar83 = *(undefined4 *)(uVar42 + 0x48 + lVar30);
    auVar96._4_4_ = uVar83;
    auVar96._0_4_ = uVar83;
    auVar96._8_4_ = uVar83;
    auVar96._12_4_ = uVar83;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = *(ulong *)(local_12e8 + 0x20 + local_12c0);
    auVar48 = vpmovzxbd_avx(auVar115);
    auVar48 = vcvtdq2ps_avx(auVar48);
    auVar51 = vfmadd213ps_fma(auVar48,auVar96,auVar86);
    auVar118._8_8_ = 0;
    auVar118._0_8_ = *(ulong *)(local_12f0 + 0x20 + local_12c0);
    auVar48 = vpmovzxbd_avx(auVar118);
    auVar48 = vcvtdq2ps_avx(auVar48);
    auVar106 = vfmadd213ps_fma(auVar48,auVar96,auVar86);
    uVar83 = *(undefined4 *)(uVar42 + 0x40 + lVar30);
    auVar87._4_4_ = uVar83;
    auVar87._0_4_ = uVar83;
    auVar87._8_4_ = uVar83;
    auVar87._12_4_ = uVar83;
    uVar83 = *(undefined4 *)(uVar42 + 0x4c + lVar30);
    auVar97._4_4_ = uVar83;
    auVar97._0_4_ = uVar83;
    auVar97._8_4_ = uVar83;
    auVar97._12_4_ = uVar83;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = *(ulong *)(local_12f8 + 0x20 + local_12c0);
    auVar48 = vpmovzxbd_avx(auVar122);
    auVar48 = vcvtdq2ps_avx(auVar48);
    auVar85 = vfmadd213ps_fma(auVar48,auVar97,auVar87);
    auVar123._8_8_ = 0;
    auVar123._0_8_ = *(ulong *)(local_1300 + 0x20 + local_12c0);
    auVar48 = vpmovzxbd_avx(auVar123);
    auVar48 = vcvtdq2ps_avx(auVar48);
    auVar86 = vfmadd213ps_fma(auVar48,auVar97,auVar87);
    auVar48 = vfmadd213ps_avx512vl(auVar49,auVar135._0_16_,auVar139._0_16_);
    auVar49 = vfmadd213ps_avx512vl(auVar51,auVar136._0_16_,auVar140._0_16_);
    auVar48 = vpmaxsd_avx(auVar48,auVar49);
    auVar51 = vfmadd213ps_avx512vl(auVar85,auVar137._0_16_,auVar141._0_16_);
    auVar49 = vfmadd213ps_avx512vl(auVar50,auVar135._0_16_,auVar139._0_16_);
    auVar50 = vfmadd213ps_avx512vl(auVar106,auVar136._0_16_,auVar140._0_16_);
    auVar49 = vpminsd_avx(auVar49,auVar50);
    auVar50 = vfmadd213ps_avx512vl(auVar86,auVar137._0_16_,auVar141._0_16_);
    auVar51 = vpmaxsd_avx512vl(auVar51,auVar142._0_16_);
    local_11d0 = vpmaxsd_avx(auVar48,auVar51);
    auVar48 = vpminsd_avx512vl(auVar50,auVar138._0_16_);
    auVar48 = vpminsd_avx(auVar49,auVar48);
    uVar35 = vpcmpd_avx512vl(local_11d0,auVar48,2);
    uVar35 = ((byte)uVar17 & 0xf) & uVar35;
    if ((char)uVar35 != '\0') {
LAB_006f65ac:
      lVar30 = 0;
      for (uVar39 = uVar35; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      fVar114 = *(float *)(ray + k * 4 + 0x80);
      if (*(float *)(local_11d0 + lVar30 * 4) <= fVar114) {
        uVar34 = *(uint *)(local_12c0 + 0x50);
        uVar32 = *(uint *)(local_12c0 + 4 + lVar30 * 8);
        pGVar3 = (context->scene->geometries).items[uVar34].ptr;
        lVar4 = *(long *)&pGVar3->field_0x58;
        lVar5 = *(long *)&pGVar3[1].time_range.upper;
        lVar36 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)uVar32;
        uVar39 = *(ulong *)(local_12c0 + lVar30 * 8);
        auVar88._8_8_ = 0;
        auVar88._0_8_ = uVar39;
        auVar48 = vpandq_avx512vl(auVar88,auVar143._0_16_);
        auVar85 = vpmovzxwd_avx(auVar48);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = *(ulong *)(lVar4 + lVar36);
        auVar48 = vpaddd_avx(auVar101,auVar85);
        auVar49 = vpmulld_avx(auVar101,auVar85);
        auVar49 = vpsrlq_avx(auVar49,0x20);
        auVar48 = vpaddd_avx(auVar48,auVar49);
        lVar43 = CONCAT44((int)((ulong)ray >> 0x20),auVar48._0_4_);
        p_Var6 = pGVar3[1].intersectionFilterN;
        auVar48 = *(undefined1 (*) [16])(lVar5 + (lVar43 + 1) * (long)p_Var6);
        uVar44 = *(ulong *)(lVar4 + lVar36) >> 0x20;
        lVar41 = lVar43 + uVar44 + 1;
        auVar49 = *(undefined1 (*) [16])(lVar5 + (lVar43 + uVar44) * (long)p_Var6);
        auVar50 = *(undefined1 (*) [16])(lVar5 + lVar41 * (long)p_Var6);
        uVar40 = (ulong)(-1 < (short)uVar39);
        auVar51 = *(undefined1 (*) [16])(lVar5 + (lVar43 + uVar40 + 1) * (long)p_Var6);
        lVar30 = uVar40 + lVar41;
        auVar106 = *(undefined1 (*) [16])(lVar5 + lVar30 * (long)p_Var6);
        uVar40 = 0;
        if (-1 < (short)(uVar39 >> 0x10)) {
          uVar40 = uVar44;
        }
        auVar86 = *(undefined1 (*) [16])(lVar5 + (lVar43 + uVar44 + uVar40) * (long)p_Var6);
        auVar87 = *(undefined1 (*) [16])(lVar5 + (lVar41 + uVar40) * (long)p_Var6);
        auVar75._16_16_ = *(undefined1 (*) [16])(lVar5 + (uVar40 + lVar30) * (long)p_Var6);
        auVar75._0_16_ = auVar50;
        auVar95 = vunpcklps_avx(auVar48,auVar106);
        auVar94 = vunpckhps_avx(auVar48,auVar106);
        auVar96 = vunpcklps_avx(auVar51,auVar50);
        auVar51 = vunpckhps_avx(auVar51,auVar50);
        auVar97 = vunpcklps_avx(auVar94,auVar51);
        auVar100 = vunpcklps_avx(auVar95,auVar96);
        auVar51 = vunpckhps_avx(auVar95,auVar96);
        auVar95 = vunpcklps_avx(auVar49,auVar87);
        auVar94 = vunpckhps_avx(auVar49,auVar87);
        auVar96 = vunpcklps_avx(auVar50,auVar86);
        auVar86 = vunpckhps_avx(auVar50,auVar86);
        auVar94 = vunpcklps_avx(auVar94,auVar86);
        auVar107 = vunpcklps_avx(auVar95,auVar96);
        auVar86 = vunpckhps_avx(auVar95,auVar96);
        auVar77._16_16_ = auVar87;
        auVar77._0_16_ = auVar49;
        auVar78._16_16_ = auVar106;
        auVar78._0_16_ = auVar48;
        auVar65 = vunpcklps_avx(auVar78,auVar77);
        auVar79._16_16_ = auVar50;
        auVar79._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)p_Var6 * lVar43);
        auVar80 = vunpcklps_avx(auVar79,auVar75);
        auVar71 = vunpcklps_avx(auVar80,auVar65);
        auVar72 = vunpckhps_avx(auVar80,auVar65);
        auVar65 = vunpckhps_avx(auVar78,auVar77);
        auVar80 = vunpckhps_avx(auVar79,auVar75);
        auVar73 = vunpcklps_avx(auVar80,auVar65);
        auVar65._16_16_ = auVar100;
        auVar65._0_16_ = auVar100;
        auVar80._16_16_ = auVar51;
        auVar80._0_16_ = auVar51;
        auVar66._16_16_ = auVar97;
        auVar66._0_16_ = auVar97;
        auVar69._16_16_ = auVar107;
        auVar69._0_16_ = auVar107;
        auVar76._16_16_ = auVar86;
        auVar76._0_16_ = auVar86;
        auVar70._16_16_ = auVar94;
        auVar70._0_16_ = auVar94;
        auVar65 = vsubps_avx(auVar71,auVar65);
        auVar80 = vsubps_avx(auVar72,auVar80);
        auVar79 = vsubps_avx(auVar73,auVar66);
        auVar78 = vsubps_avx(auVar69,auVar71);
        auVar77 = vsubps_avx(auVar76,auVar72);
        auVar66 = vsubps_avx512vl(auVar70,auVar73);
        auVar67 = vmulps_avx512vl(auVar80,auVar66);
        auVar48 = vfmsub231ps_fma(auVar67,auVar77,auVar79);
        auVar68._4_4_ = auVar79._4_4_ * auVar78._4_4_;
        auVar68._0_4_ = auVar79._0_4_ * auVar78._0_4_;
        auVar68._8_4_ = auVar79._8_4_ * auVar78._8_4_;
        auVar68._12_4_ = auVar79._12_4_ * auVar78._12_4_;
        auVar68._16_4_ = auVar79._16_4_ * auVar78._16_4_;
        auVar68._20_4_ = auVar79._20_4_ * auVar78._20_4_;
        auVar68._24_4_ = auVar79._24_4_ * auVar78._24_4_;
        auVar68._28_4_ = auVar51._12_4_;
        auVar68 = vfmsub231ps_avx512vl(auVar68,auVar66,auVar65);
        auVar74._4_4_ = auVar65._4_4_ * auVar77._4_4_;
        auVar74._0_4_ = auVar65._0_4_ * auVar77._0_4_;
        auVar74._8_4_ = auVar65._8_4_ * auVar77._8_4_;
        auVar74._12_4_ = auVar65._12_4_ * auVar77._12_4_;
        auVar74._16_4_ = auVar65._16_4_ * auVar77._16_4_;
        auVar74._20_4_ = auVar65._20_4_ * auVar77._20_4_;
        auVar74._24_4_ = auVar65._24_4_ * auVar77._24_4_;
        auVar74._28_4_ = auVar97._12_4_;
        uVar83 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar127._4_4_ = uVar83;
        auVar127._0_4_ = uVar83;
        auVar127._8_4_ = uVar83;
        auVar127._12_4_ = uVar83;
        auVar127._16_4_ = uVar83;
        auVar127._20_4_ = uVar83;
        auVar127._24_4_ = uVar83;
        auVar127._28_4_ = uVar83;
        auVar69 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
        auVar70 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar83 = *(undefined4 *)(ray + k * 4);
        auVar67._4_4_ = uVar83;
        auVar67._0_4_ = uVar83;
        auVar67._8_4_ = uVar83;
        auVar67._12_4_ = uVar83;
        auVar67._16_4_ = uVar83;
        auVar67._20_4_ = uVar83;
        auVar67._24_4_ = uVar83;
        auVar67._28_4_ = uVar83;
        auVar67 = vsubps_avx512vl(auVar71,auVar67);
        auVar49 = vfmsub231ps_fma(auVar74,auVar78,auVar80);
        uVar83 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar71._4_4_ = uVar83;
        auVar71._0_4_ = uVar83;
        auVar71._8_4_ = uVar83;
        auVar71._12_4_ = uVar83;
        auVar71._16_4_ = uVar83;
        auVar71._20_4_ = uVar83;
        auVar71._24_4_ = uVar83;
        auVar71._28_4_ = uVar83;
        auVar71 = vsubps_avx512vl(auVar72,auVar71);
        uVar83 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar72._4_4_ = uVar83;
        auVar72._0_4_ = uVar83;
        auVar72._8_4_ = uVar83;
        auVar72._12_4_ = uVar83;
        auVar72._16_4_ = uVar83;
        auVar72._20_4_ = uVar83;
        auVar72._24_4_ = uVar83;
        auVar72._28_4_ = uVar83;
        auVar72 = vsubps_avx512vl(auVar73,auVar72);
        auVar73 = vmulps_avx512vl(auVar69,auVar72);
        auVar74 = vfmsub231ps_avx512vl(auVar73,auVar71,auVar70);
        auVar73 = vmulps_avx512vl(auVar70,auVar67);
        auVar75 = vfmsub231ps_avx512vl(auVar73,auVar72,auVar127);
        auVar73 = vmulps_avx512vl(auVar127,auVar71);
        auVar76 = vfmsub231ps_avx512vl(auVar73,auVar67,auVar69);
        auVar73 = vmulps_avx512vl(ZEXT1632(auVar49),auVar70);
        auVar73 = vfmadd231ps_avx512vl(auVar73,auVar68,auVar69);
        local_1140 = vfmadd231ps_avx512vl(auVar73,ZEXT1632(auVar48),auVar127);
        vandps_avx512vl(local_1140,auVar144._0_32_);
        auVar73._8_4_ = 0x80000000;
        auVar73._0_8_ = 0x8000000080000000;
        auVar73._12_4_ = 0x80000000;
        auVar73._16_4_ = 0x80000000;
        auVar73._20_4_ = 0x80000000;
        auVar73._24_4_ = 0x80000000;
        auVar73._28_4_ = 0x80000000;
        vandps_avx512vl(local_1140,auVar73);
        auVar73 = vmulps_avx512vl(auVar66,auVar76);
        auVar77 = vfmadd231ps_avx512vl(auVar73,auVar75,auVar77);
        auVar78 = vfmadd231ps_avx512vl(auVar77,auVar74,auVar78);
        fVar126 = local_1140._0_4_;
        auVar124._0_4_ = (float)((uint)fVar126 ^ auVar78._0_4_);
        fVar128 = local_1140._4_4_;
        auVar124._4_4_ = (float)((uint)fVar128 ^ auVar78._4_4_);
        fVar129 = local_1140._8_4_;
        auVar124._8_4_ = (float)((uint)fVar129 ^ auVar78._8_4_);
        fVar130 = local_1140._12_4_;
        auVar124._12_4_ = (float)((uint)fVar130 ^ auVar78._12_4_);
        fVar131 = local_1140._16_4_;
        auVar124._16_4_ = (float)((uint)fVar131 ^ auVar78._16_4_);
        fVar132 = local_1140._20_4_;
        auVar124._20_4_ = (float)((uint)fVar132 ^ auVar78._20_4_);
        fVar133 = local_1140._24_4_;
        auVar124._24_4_ = (float)((uint)fVar133 ^ auVar78._24_4_);
        uVar47 = local_1140._28_4_;
        auVar124._28_4_ = (float)(uVar47 ^ auVar78._28_4_);
        auVar79 = vmulps_avx512vl(auVar79,auVar76);
        auVar80 = vfmadd231ps_avx512vl(auVar79,auVar80,auVar75);
        auVar65 = vfmadd231ps_avx512vl(auVar80,auVar65,auVar74);
        auVar125._0_4_ = (float)((uint)fVar126 ^ auVar65._0_4_);
        auVar125._4_4_ = (float)((uint)fVar128 ^ auVar65._4_4_);
        auVar125._8_4_ = (float)((uint)fVar129 ^ auVar65._8_4_);
        auVar125._12_4_ = (float)((uint)fVar130 ^ auVar65._12_4_);
        auVar125._16_4_ = (float)((uint)fVar131 ^ auVar65._16_4_);
        auVar125._20_4_ = (float)((uint)fVar132 ^ auVar65._20_4_);
        auVar125._24_4_ = (float)((uint)fVar133 ^ auVar65._24_4_);
        auVar125._28_4_ = (float)(uVar47 ^ auVar65._28_4_);
        uVar17 = vcmpps_avx512vl(auVar124,ZEXT832(0) << 0x20,5);
        uVar14 = vcmpps_avx512vl(auVar125,ZEXT832(0) << 0x20,5);
        uVar15 = vcmpps_avx512vl(local_1140,ZEXT832(0) << 0x20,4);
        auVar134._0_4_ = auVar124._0_4_ + auVar125._0_4_;
        auVar134._4_4_ = auVar124._4_4_ + auVar125._4_4_;
        auVar134._8_4_ = auVar124._8_4_ + auVar125._8_4_;
        auVar134._12_4_ = auVar124._12_4_ + auVar125._12_4_;
        auVar134._16_4_ = auVar124._16_4_ + auVar125._16_4_;
        auVar134._20_4_ = auVar124._20_4_ + auVar125._20_4_;
        auVar134._24_4_ = auVar124._24_4_ + auVar125._24_4_;
        auVar134._28_4_ = auVar124._28_4_ + auVar125._28_4_;
        uVar16 = vcmpps_avx512vl(auVar134,local_1140,2);
        local_111f = (byte)uVar17 & (byte)uVar14 & (byte)uVar15 & (byte)uVar16;
        if (local_111f != 0) {
          auVar21._4_4_ = auVar72._4_4_ * auVar49._4_4_;
          auVar21._0_4_ = auVar72._0_4_ * auVar49._0_4_;
          auVar21._8_4_ = auVar72._8_4_ * auVar49._8_4_;
          auVar21._12_4_ = auVar72._12_4_ * auVar49._12_4_;
          auVar21._16_4_ = auVar72._16_4_ * 0.0;
          auVar21._20_4_ = auVar72._20_4_ * 0.0;
          auVar21._24_4_ = auVar72._24_4_ * 0.0;
          auVar21._28_4_ = auVar72._28_4_;
          auVar50 = vfmadd213ps_fma(auVar71,auVar68,auVar21);
          auVar50 = vfmadd213ps_fma(auVar67,ZEXT1632(auVar48),ZEXT1632(auVar50));
          local_1160._0_4_ = (float)((uint)fVar126 ^ auVar50._0_4_);
          local_1160._4_4_ = (float)((uint)fVar128 ^ auVar50._4_4_);
          local_1160._8_4_ = (float)((uint)fVar129 ^ auVar50._8_4_);
          local_1160._12_4_ = (float)((uint)fVar130 ^ auVar50._12_4_);
          local_1160._16_4_ = fVar131;
          local_1160._20_4_ = fVar132;
          local_1160._24_4_ = fVar133;
          local_1160._28_4_ = uVar47;
          uVar83 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar19._4_4_ = uVar83;
          auVar19._0_4_ = uVar83;
          auVar19._8_4_ = uVar83;
          auVar19._12_4_ = uVar83;
          auVar19._16_4_ = uVar83;
          auVar19._20_4_ = uVar83;
          auVar19._24_4_ = uVar83;
          auVar19._28_4_ = uVar83;
          auVar65 = vmulps_avx512vl(local_1140,auVar19);
          auVar22._4_4_ = fVar114 * fVar128;
          auVar22._0_4_ = fVar114 * fVar126;
          auVar22._8_4_ = fVar114 * fVar129;
          auVar22._12_4_ = fVar114 * fVar130;
          auVar22._16_4_ = fVar114 * fVar131;
          auVar22._20_4_ = fVar114 * fVar132;
          auVar22._24_4_ = fVar114 * fVar133;
          auVar22._28_4_ = fVar114;
          uVar17 = vcmpps_avx512vl(local_1160,auVar22,2);
          uVar14 = vcmpps_avx512vl(auVar65,local_1160,1);
          local_111f = (byte)uVar17 & (byte)uVar14 & local_111f;
          uVar47 = (uint)local_111f;
          if (local_111f != 0) {
            auVar65 = vsubps_avx(local_1140,auVar125);
            auVar65 = vblendps_avx(auVar124,auVar65,0xf0);
            auVar80 = vsubps_avx(local_1140,auVar124);
            local_1180 = vblendps_avx(auVar125,auVar80,0xf0);
            local_10a0._0_4_ = auVar48._0_4_ * 1.0;
            local_10a0._4_4_ = auVar48._4_4_ * 1.0;
            local_10a0._8_4_ = auVar48._8_4_ * 1.0;
            local_10a0._12_4_ = auVar48._12_4_ * 1.0;
            local_10a0._16_4_ = 0x80000000;
            local_10a0._20_4_ = 0x80000000;
            local_10a0._24_4_ = 0x80000000;
            local_10a0._28_4_ = 0;
            local_1080._4_4_ = auVar68._4_4_ * 1.0;
            local_1080._0_4_ = auVar68._0_4_ * 1.0;
            local_1080._8_4_ = auVar68._8_4_ * 1.0;
            local_1080._12_4_ = auVar68._12_4_ * 1.0;
            local_1080._16_4_ = auVar68._16_4_ * -1.0;
            local_1080._20_4_ = auVar68._20_4_ * -1.0;
            local_1080._24_4_ = auVar68._24_4_ * -1.0;
            local_1080._28_4_ = 0;
            local_1060._4_4_ = auVar49._4_4_ * 1.0;
            local_1060._0_4_ = auVar49._0_4_ * 1.0;
            local_1060._8_4_ = auVar49._8_4_ * 1.0;
            local_1060._12_4_ = auVar49._12_4_ * 1.0;
            local_1060._16_4_ = 0x80000000;
            local_1060._20_4_ = 0x80000000;
            local_1060._24_4_ = 0x80000000;
            local_1060._28_4_ = 0;
            uVar83 = auVar85._0_4_;
            auVar108._4_4_ = uVar83;
            auVar108._0_4_ = uVar83;
            auVar108._8_4_ = uVar83;
            auVar108._12_4_ = uVar83;
            auVar108._16_4_ = uVar83;
            auVar108._20_4_ = uVar83;
            auVar108._24_4_ = uVar83;
            auVar108._28_4_ = uVar83;
            auVar80 = vpaddd_avx2(auVar108,_DAT_01fec4a0);
            auVar116._0_4_ = (float)(int)(*(ushort *)(lVar4 + 8 + lVar36) - 1);
            auVar116._4_12_ = auVar85._4_12_;
            auVar119._4_12_ = ZEXT812(0) << 0x20;
            auVar119._0_4_ = auVar116._0_4_;
            auVar49 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar119);
            auVar48 = vfnmadd213ss_fma(auVar49,auVar116,ZEXT416(0x40000000));
            fVar114 = auVar48._0_4_ * auVar49._0_4_;
            auVar80 = vcvtdq2ps_avx(auVar80);
            fVar105 = (fVar126 * auVar80._0_4_ + auVar65._0_4_) * fVar114;
            fVar109 = (fVar128 * auVar80._4_4_ + auVar65._4_4_) * fVar114;
            local_11a0._4_4_ = fVar109;
            local_11a0._0_4_ = fVar105;
            fVar110 = (fVar129 * auVar80._8_4_ + auVar65._8_4_) * fVar114;
            local_11a0._8_4_ = fVar110;
            fVar111 = (fVar130 * auVar80._12_4_ + auVar65._12_4_) * fVar114;
            local_11a0._12_4_ = fVar111;
            fVar112 = (fVar131 * auVar80._16_4_ + auVar65._16_4_) * fVar114;
            local_11a0._16_4_ = fVar112;
            fVar113 = (fVar132 * auVar80._20_4_ + auVar65._20_4_) * fVar114;
            local_11a0._20_4_ = fVar113;
            fVar114 = (fVar133 * auVar80._24_4_ + auVar65._24_4_) * fVar114;
            local_11a0._24_4_ = fVar114;
            local_11a0._28_4_ = auVar80._28_4_ + auVar65._28_4_;
            if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar117._8_4_ = 1;
              auVar117._0_8_ = 0x100000001;
              auVar117._12_4_ = 1;
              auVar117._16_4_ = 1;
              auVar117._20_4_ = 1;
              auVar117._24_4_ = 1;
              auVar117._28_4_ = 1;
              auVar65 = vpermd_avx2(auVar117,ZEXT1632(auVar85));
              auVar65 = vpaddd_avx2(auVar65,_DAT_01fec4c0);
              auVar65 = vcvtdq2ps_avx(auVar65);
              local_1210 = auVar135._0_16_;
              auVar48 = vcvtsi2ss_avx512f(local_1210,*(ushort *)(lVar4 + 10 + lVar36) - 1);
              auVar23._12_4_ = 0;
              auVar23._0_12_ = ZEXT812(0);
              auVar49 = vrcp14ss_avx512f(auVar23 << 0x20,ZEXT416(auVar48._0_4_));
              auVar48 = vfnmadd213ss_fma(auVar49,auVar48,ZEXT416(0x40000000));
              fVar13 = auVar49._0_4_ * auVar48._0_4_;
              auVar80 = vrcp14ps_avx512vl(local_1140);
              auVar20._8_4_ = 0x3f800000;
              auVar20._0_8_ = 0x3f8000003f800000;
              auVar20._12_4_ = 0x3f800000;
              auVar20._16_4_ = 0x3f800000;
              auVar20._20_4_ = 0x3f800000;
              auVar20._24_4_ = 0x3f800000;
              auVar20._28_4_ = 0x3f800000;
              auVar79 = vfnmadd213ps_avx512vl(local_1140,auVar80,auVar20);
              auVar48 = vfmadd132ps_fma(auVar79,auVar80,auVar80);
              fVar98 = auVar48._0_4_;
              local_10c0._0_4_ = fVar98 * local_1160._0_4_;
              fVar102 = auVar48._4_4_;
              local_10c0._4_4_ = fVar102 * local_1160._4_4_;
              fVar103 = auVar48._8_4_;
              local_10c0._8_4_ = fVar103 * local_1160._8_4_;
              fVar104 = auVar48._12_4_;
              local_10c0._12_4_ = fVar104 * local_1160._12_4_;
              local_10c0._16_4_ = fVar131 * 0.0;
              local_10c0._20_4_ = fVar132 * 0.0;
              local_10c0._24_4_ = fVar133 * 0.0;
              local_10c0._28_4_ = 0;
              auVar120 = ZEXT3264(local_10c0);
              local_1100[0] = fVar105 * fVar98;
              local_1100[1] = fVar109 * fVar102;
              local_1100[2] = fVar110 * fVar103;
              local_1100[3] = fVar111 * fVar104;
              fStack_10f0 = fVar112 * 0.0;
              fStack_10ec = fVar113 * 0.0;
              fStack_10e8 = fVar114 * 0.0;
              uStack_10e4 = auVar80._28_4_;
              local_10e0[0] = (fVar126 * auVar65._0_4_ + local_1180._0_4_) * fVar13 * fVar98;
              local_10e0[1] = (fVar128 * auVar65._4_4_ + local_1180._4_4_) * fVar13 * fVar102;
              local_10e0[2] = (fVar129 * auVar65._8_4_ + local_1180._8_4_) * fVar13 * fVar103;
              local_10e0[3] = (fVar130 * auVar65._12_4_ + local_1180._12_4_) * fVar13 * fVar104;
              fStack_10d0 = (fVar131 * auVar65._16_4_ + local_1180._16_4_) * fVar13 * 0.0;
              fStack_10cc = (fVar132 * auVar65._20_4_ + local_1180._20_4_) * fVar13 * 0.0;
              fStack_10c8 = (fVar133 * auVar65._24_4_ + local_1180._24_4_) * fVar13 * 0.0;
              fStack_10c4 = auVar65._28_4_ + local_1180._28_4_;
              auVar89._8_4_ = 0x7f800000;
              auVar89._0_8_ = 0x7f8000007f800000;
              auVar89._12_4_ = 0x7f800000;
              auVar89._16_4_ = 0x7f800000;
              auVar89._20_4_ = 0x7f800000;
              auVar89._24_4_ = 0x7f800000;
              auVar89._28_4_ = 0x7f800000;
              auVar65 = vblendmps_avx512vl(auVar89,local_10c0);
              auVar81._0_4_ =
                   (uint)(local_111f & 1) * auVar65._0_4_ |
                   (uint)!(bool)(local_111f & 1) * 0x7f800000;
              bVar12 = (bool)(local_111f >> 1 & 1);
              auVar81._4_4_ = (uint)bVar12 * auVar65._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_111f >> 2 & 1);
              auVar81._8_4_ = (uint)bVar12 * auVar65._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_111f >> 3 & 1);
              auVar81._12_4_ = (uint)bVar12 * auVar65._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_111f >> 4 & 1);
              auVar81._16_4_ = (uint)bVar12 * auVar65._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_111f >> 5 & 1);
              auVar81._20_4_ = (uint)bVar12 * auVar65._20_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_111f >> 6 & 1);
              auVar81._24_4_ = (uint)bVar12 * auVar65._24_4_ | (uint)!bVar12 * 0x7f800000;
              auVar81._28_4_ =
                   (uint)(local_111f >> 7) * auVar65._28_4_ |
                   (uint)!(bool)(local_111f >> 7) * 0x7f800000;
              auVar65 = vshufps_avx(auVar81,auVar81,0xb1);
              auVar65 = vminps_avx(auVar81,auVar65);
              auVar80 = vshufpd_avx(auVar65,auVar65,5);
              auVar65 = vminps_avx(auVar65,auVar80);
              auVar80 = vpermpd_avx2(auVar65,0x4e);
              auVar65 = vminps_avx(auVar65,auVar80);
              uVar17 = vcmpps_avx512vl(auVar81,auVar65,0);
              uVar31 = uVar47;
              if ((local_111f & (byte)uVar17) != 0) {
                uVar31 = (uint)(local_111f & (byte)uVar17);
              }
              uVar18 = 0;
              for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
                uVar18 = uVar18 + 1;
              }
              uVar39 = (ulong)uVar18;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_1280 = vmovdqa64_avx512vl(auVar142._0_16_);
                local_1270 = auVar141._0_16_;
                local_1260 = auVar140._0_16_;
                local_1250 = auVar139._0_16_;
                local_1240 = vmovdqa64_avx512vl(auVar138._0_16_);
                local_1230 = auVar137._0_16_;
                local_1220 = auVar136._0_16_;
                local_11f0 = vpbroadcastd_avx512vl();
                local_1200 = vpbroadcastd_avx512vl();
                local_1340 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                local_11c0 = local_10c0;
                do {
                  fVar114 = local_1100[uVar39];
                  local_1000._4_4_ = fVar114;
                  local_1000._0_4_ = fVar114;
                  local_1000._8_4_ = fVar114;
                  local_1000._12_4_ = fVar114;
                  fVar114 = local_10e0[uVar39];
                  local_ff0._4_4_ = fVar114;
                  local_ff0._0_4_ = fVar114;
                  local_ff0._8_4_ = fVar114;
                  local_ff0._12_4_ = fVar114;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10c0 + uVar39 * 4);
                  local_12b0.context = context->user;
                  local_1030 = *(int *)(local_10a0 + uVar39 * 4);
                  uVar83 = *(undefined4 *)(local_1080 + uVar39 * 4);
                  local_1020._4_4_ = uVar83;
                  local_1020._0_4_ = uVar83;
                  local_1020._8_4_ = uVar83;
                  local_1020._12_4_ = uVar83;
                  uVar83 = *(undefined4 *)(local_1060 + uVar39 * 4);
                  local_1010._4_4_ = uVar83;
                  local_1010._0_4_ = uVar83;
                  local_1010._8_4_ = uVar83;
                  local_1010._12_4_ = uVar83;
                  iStack_102c = local_1030;
                  iStack_1028 = local_1030;
                  iStack_1024 = local_1030;
                  local_fe0 = local_1200._0_8_;
                  uStack_fd8 = local_1200._8_8_;
                  local_fd0 = local_11f0;
                  vpcmpeqd_avx2(ZEXT1632(local_11f0),ZEXT1632(local_11f0));
                  uStack_fbc = (local_12b0.context)->instID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = (local_12b0.context)->instPrimID[0];
                  uStack_fac = uStack_fb0;
                  uStack_fa8 = uStack_fb0;
                  uStack_fa4 = uStack_fb0;
                  local_1330 = local_11e0;
                  local_12b0.valid = (int *)local_1330;
                  local_12b0.geometryUserPtr = pGVar3->userPtr;
                  local_12b0.hit = (RTCHitN *)&local_1030;
                  local_12b0.N = 4;
                  local_12b0.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->intersectionFilterN)(&local_12b0);
                    auVar120 = ZEXT3264(local_11c0);
                  }
                  uVar40 = vptestmd_avx512vl(local_1330,local_1330);
                  if ((uVar40 & 0xf) == 0) {
LAB_006f6e35:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_1340._0_4_;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&local_12b0);
                      auVar120 = ZEXT3264(local_11c0);
                    }
                    uVar40 = vptestmd_avx512vl(local_1330,local_1330);
                    uVar40 = uVar40 & 0xf;
                    bVar46 = (byte)uVar40;
                    if (bVar46 == 0) goto LAB_006f6e35;
                    iVar24 = *(int *)(local_12b0.hit + 4);
                    iVar25 = *(int *)(local_12b0.hit + 8);
                    iVar26 = *(int *)(local_12b0.hit + 0xc);
                    bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar40 >> 2) & 1);
                    bVar11 = SUB81(uVar40 >> 3,0);
                    *(uint *)(local_12b0.ray + 0xc0) =
                         (uint)(bVar46 & 1) * *(int *)local_12b0.hit |
                         (uint)!(bool)(bVar46 & 1) * *(int *)(local_12b0.ray + 0xc0);
                    *(uint *)(local_12b0.ray + 0xc4) =
                         (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(local_12b0.ray + 0xc4);
                    *(uint *)(local_12b0.ray + 200) =
                         (uint)bVar9 * iVar25 | (uint)!bVar9 * *(int *)(local_12b0.ray + 200);
                    *(uint *)(local_12b0.ray + 0xcc) =
                         (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_12b0.ray + 0xcc);
                    iVar24 = *(int *)(local_12b0.hit + 0x14);
                    iVar25 = *(int *)(local_12b0.hit + 0x18);
                    iVar26 = *(int *)(local_12b0.hit + 0x1c);
                    bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar40 >> 2) & 1);
                    bVar11 = SUB81(uVar40 >> 3,0);
                    *(uint *)(local_12b0.ray + 0xd0) =
                         (uint)(bVar46 & 1) * *(int *)(local_12b0.hit + 0x10) |
                         (uint)!(bool)(bVar46 & 1) * *(int *)(local_12b0.ray + 0xd0);
                    *(uint *)(local_12b0.ray + 0xd4) =
                         (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(local_12b0.ray + 0xd4);
                    *(uint *)(local_12b0.ray + 0xd8) =
                         (uint)bVar9 * iVar25 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xd8);
                    *(uint *)(local_12b0.ray + 0xdc) =
                         (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_12b0.ray + 0xdc);
                    iVar24 = *(int *)(local_12b0.hit + 0x24);
                    iVar25 = *(int *)(local_12b0.hit + 0x28);
                    iVar26 = *(int *)(local_12b0.hit + 0x2c);
                    bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar40 >> 2) & 1);
                    bVar11 = SUB81(uVar40 >> 3,0);
                    *(uint *)(local_12b0.ray + 0xe0) =
                         (uint)(bVar46 & 1) * *(int *)(local_12b0.hit + 0x20) |
                         (uint)!(bool)(bVar46 & 1) * *(int *)(local_12b0.ray + 0xe0);
                    *(uint *)(local_12b0.ray + 0xe4) =
                         (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(local_12b0.ray + 0xe4);
                    *(uint *)(local_12b0.ray + 0xe8) =
                         (uint)bVar9 * iVar25 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xe8);
                    *(uint *)(local_12b0.ray + 0xec) =
                         (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_12b0.ray + 0xec);
                    iVar24 = *(int *)(local_12b0.hit + 0x34);
                    iVar25 = *(int *)(local_12b0.hit + 0x38);
                    iVar26 = *(int *)(local_12b0.hit + 0x3c);
                    bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar40 >> 2) & 1);
                    bVar11 = SUB81(uVar40 >> 3,0);
                    *(uint *)(local_12b0.ray + 0xf0) =
                         (uint)(bVar46 & 1) * *(int *)(local_12b0.hit + 0x30) |
                         (uint)!(bool)(bVar46 & 1) * *(int *)(local_12b0.ray + 0xf0);
                    *(uint *)(local_12b0.ray + 0xf4) =
                         (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(local_12b0.ray + 0xf4);
                    *(uint *)(local_12b0.ray + 0xf8) =
                         (uint)bVar9 * iVar25 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xf8);
                    *(uint *)(local_12b0.ray + 0xfc) =
                         (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_12b0.ray + 0xfc);
                    iVar24 = *(int *)(local_12b0.hit + 0x44);
                    iVar25 = *(int *)(local_12b0.hit + 0x48);
                    iVar26 = *(int *)(local_12b0.hit + 0x4c);
                    bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar40 >> 2) & 1);
                    bVar11 = SUB81(uVar40 >> 3,0);
                    *(uint *)(local_12b0.ray + 0x100) =
                         (uint)(bVar46 & 1) * *(int *)(local_12b0.hit + 0x40) |
                         (uint)!(bool)(bVar46 & 1) * *(int *)(local_12b0.ray + 0x100);
                    *(uint *)(local_12b0.ray + 0x104) =
                         (uint)bVar12 * iVar24 | (uint)!bVar12 * *(int *)(local_12b0.ray + 0x104);
                    *(uint *)(local_12b0.ray + 0x108) =
                         (uint)bVar9 * iVar25 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0x108);
                    *(uint *)(local_12b0.ray + 0x10c) =
                         (uint)bVar11 * iVar26 | (uint)!bVar11 * *(int *)(local_12b0.ray + 0x10c);
                    auVar48 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x50));
                    *(undefined1 (*) [16])(local_12b0.ray + 0x110) = auVar48;
                    auVar48 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x60));
                    *(undefined1 (*) [16])(local_12b0.ray + 0x120) = auVar48;
                    auVar48 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x70));
                    *(undefined1 (*) [16])(local_12b0.ray + 0x130) = auVar48;
                    auVar48 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x80));
                    *(undefined1 (*) [16])(local_12b0.ray + 0x140) = auVar48;
                    local_1340._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_1340._4_4_ = 0;
                    local_1340._8_4_ = 0;
                    local_1340._12_4_ = 0;
                  }
                  bVar46 = ~(byte)(1 << ((uint)uVar39 & 0x1f)) & (byte)uVar47;
                  auVar90._4_4_ = local_1340._0_4_;
                  auVar90._0_4_ = local_1340._0_4_;
                  auVar90._8_4_ = local_1340._0_4_;
                  auVar90._12_4_ = local_1340._0_4_;
                  auVar90._16_4_ = local_1340._0_4_;
                  auVar90._20_4_ = local_1340._0_4_;
                  auVar90._24_4_ = local_1340._0_4_;
                  auVar90._28_4_ = local_1340._0_4_;
                  uVar17 = vcmpps_avx512vl(auVar120._0_32_,auVar90,2);
                  if ((bVar46 & (byte)uVar17) == 0) goto LAB_006f6ecf;
                  bVar46 = bVar46 & (byte)uVar17;
                  uVar47 = (uint)bVar46;
                  auVar91._8_4_ = 0x7f800000;
                  auVar91._0_8_ = 0x7f8000007f800000;
                  auVar91._12_4_ = 0x7f800000;
                  auVar91._16_4_ = 0x7f800000;
                  auVar91._20_4_ = 0x7f800000;
                  auVar91._24_4_ = 0x7f800000;
                  auVar91._28_4_ = 0x7f800000;
                  auVar65 = vblendmps_avx512vl(auVar91,auVar120._0_32_);
                  auVar82._0_4_ =
                       (uint)(bVar46 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar46 & 1) * 0x7f800000;
                  bVar12 = (bool)(bVar46 >> 1 & 1);
                  auVar82._4_4_ = (uint)bVar12 * auVar65._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(bVar46 >> 2 & 1);
                  auVar82._8_4_ = (uint)bVar12 * auVar65._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(bVar46 >> 3 & 1);
                  auVar82._12_4_ = (uint)bVar12 * auVar65._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(bVar46 >> 4 & 1);
                  auVar82._16_4_ = (uint)bVar12 * auVar65._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(bVar46 >> 5 & 1);
                  auVar82._20_4_ = (uint)bVar12 * auVar65._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(bVar46 >> 6 & 1);
                  auVar82._24_4_ = (uint)bVar12 * auVar65._24_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar82._28_4_ =
                       (uint)(bVar46 >> 7) * auVar65._28_4_ |
                       (uint)!(bool)(bVar46 >> 7) * 0x7f800000;
                  auVar65 = vshufps_avx(auVar82,auVar82,0xb1);
                  auVar65 = vminps_avx(auVar82,auVar65);
                  auVar80 = vshufpd_avx(auVar65,auVar65,5);
                  auVar65 = vminps_avx(auVar65,auVar80);
                  auVar80 = vpermpd_avx2(auVar65,0x4e);
                  auVar65 = vminps_avx(auVar65,auVar80);
                  uVar17 = vcmpps_avx512vl(auVar82,auVar65,0);
                  bVar28 = (byte)uVar17 & bVar46;
                  if (bVar28 != 0) {
                    bVar46 = bVar28;
                  }
                  uVar34 = 0;
                  for (uVar32 = (uint)bVar46; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000)
                  {
                    uVar34 = uVar34 + 1;
                  }
                  uVar39 = (ulong)uVar34;
                } while( true );
              }
              fVar114 = local_1100[uVar39];
              fVar126 = local_10e0[uVar39];
              uVar83 = *(undefined4 *)(local_10a0 + uVar39 * 4);
              uVar1 = *(undefined4 *)(local_1080 + uVar39 * 4);
              uVar2 = *(undefined4 *)(local_1060 + uVar39 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10c0 + uVar39 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar83;
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar2;
              *(float *)(ray + k * 4 + 0xf0) = fVar114;
              *(float *)(ray + k * 4 + 0x100) = fVar126;
              *(uint *)(ray + k * 4 + 0x110) = uVar32;
              *(uint *)(ray + k * 4 + 0x120) = uVar34;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
          }
        }
      }
      goto LAB_006f689c;
    }
LAB_006f6f28:
    local_12c8 = local_12c8 + 1;
  } while (local_12c8 != local_12d0);
LAB_006f6f41:
  auVar48 = vpbroadcastd_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar138 = ZEXT1664(auVar48);
  uVar35 = local_1318;
  uVar39 = local_1308;
  uVar40 = local_1310;
  uVar44 = local_1320;
LAB_006f6f5d:
  if (pauVar29 == (undefined1 (*) [16])&local_fa0) {
    return;
  }
  goto LAB_006f6172;
LAB_006f6ecf:
  auVar135 = ZEXT1664(local_1210);
  auVar136 = ZEXT1664(local_1220);
  auVar137 = ZEXT1664(local_1230);
  auVar48 = vmovdqa64_avx512vl(local_1240);
  auVar138 = ZEXT1664(auVar48);
  auVar139 = ZEXT1664(local_1250);
  auVar140 = ZEXT1664(local_1260);
  auVar141 = ZEXT1664(local_1270);
  auVar48 = vmovdqa64_avx512vl(local_1280);
  auVar142 = ZEXT1664(auVar48);
  auVar48 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar143 = ZEXT1664(auVar48);
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar144 = ZEXT3264(auVar65);
LAB_006f689c:
  uVar35 = uVar35 - 1 & uVar35;
  if (uVar35 == 0) goto LAB_006f6f28;
  goto LAB_006f65ac;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }